

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

Result<wasm::Ok> *
wasm::WATParser::absheaptype<wasm::WATParser::NullCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,NullCtx *ctx,Shareability share)

{
  bool bVar1;
  string_view expected;
  string_view expected_00;
  string_view expected_01;
  string_view expected_02;
  string_view expected_03;
  string_view expected_04;
  string_view expected_05;
  string_view expected_06;
  string_view expected_07;
  string_view expected_08;
  string_view expected_09;
  string_view expected_10;
  string_view expected_11;
  string_view expected_12;
  string_view expected_13;
  string local_68;
  Err local_48;
  allocator<char> local_21;
  
  expected._M_str = "func";
  expected._M_len = 4;
  bVar1 = Lexer::takeKeyword(&ctx->in,expected);
  if (((((!bVar1) &&
        (expected_00._M_str = "any", expected_00._M_len = 3,
        bVar1 = Lexer::takeKeyword(&ctx->in,expected_00), !bVar1)) &&
       (expected_01._M_str = "extern", expected_01._M_len = 6,
       bVar1 = Lexer::takeKeyword(&ctx->in,expected_01), !bVar1)) &&
      (((expected_02._M_str = "eq", expected_02._M_len = 2,
        bVar1 = Lexer::takeKeyword(&ctx->in,expected_02), !bVar1 &&
        (expected_03._M_str = "i31", expected_03._M_len = 3,
        bVar1 = Lexer::takeKeyword(&ctx->in,expected_03), !bVar1)) &&
       ((expected_04._M_str = "struct", expected_04._M_len = 6,
        bVar1 = Lexer::takeKeyword(&ctx->in,expected_04), !bVar1 &&
        ((expected_05._M_str = "array", expected_05._M_len = 5,
         bVar1 = Lexer::takeKeyword(&ctx->in,expected_05), !bVar1 &&
         (expected_06._M_str = "exn", expected_06._M_len = 3,
         bVar1 = Lexer::takeKeyword(&ctx->in,expected_06), !bVar1)))))))) &&
     ((expected_07._M_str = "string", expected_07._M_len = 6,
      bVar1 = Lexer::takeKeyword(&ctx->in,expected_07), !bVar1 &&
      (((((expected_08._M_str = "cont", expected_08._M_len = 4,
          bVar1 = Lexer::takeKeyword(&ctx->in,expected_08), !bVar1 &&
          (expected_09._M_str = "none", expected_09._M_len = 4,
          bVar1 = Lexer::takeKeyword(&ctx->in,expected_09), !bVar1)) &&
         (expected_10._M_str = "noextern", expected_10._M_len = 8,
         bVar1 = Lexer::takeKeyword(&ctx->in,expected_10), !bVar1)) &&
        ((expected_11._M_str = "nofunc", expected_11._M_len = 6,
         bVar1 = Lexer::takeKeyword(&ctx->in,expected_11), !bVar1 &&
         (expected_12._M_str = "noexn", expected_12._M_len = 5,
         bVar1 = Lexer::takeKeyword(&ctx->in,expected_12), !bVar1)))) &&
       (expected_13._M_str = "nocont", expected_13._M_len = 6,
       bVar1 = Lexer::takeKeyword(&ctx->in,expected_13), !bVar1)))))) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"expected abstract heap type",&local_21);
    Lexer::err(&local_48,&ctx->in,&local_68);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    return __return_storage_ptr__;
  }
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::HeapTypeT> absheaptype(Ctx& ctx, Shareability share) {
  if (ctx.in.takeKeyword("func"sv)) {
    return ctx.makeFuncType(share);
  }
  if (ctx.in.takeKeyword("any"sv)) {
    return ctx.makeAnyType(share);
  }
  if (ctx.in.takeKeyword("extern"sv)) {
    return ctx.makeExternType(share);
  }
  if (ctx.in.takeKeyword("eq"sv)) {
    return ctx.makeEqType(share);
  }
  if (ctx.in.takeKeyword("i31"sv)) {
    return ctx.makeI31Type(share);
  }
  if (ctx.in.takeKeyword("struct"sv)) {
    return ctx.makeStructType(share);
  }
  if (ctx.in.takeKeyword("array"sv)) {
    return ctx.makeArrayType(share);
  }
  if (ctx.in.takeKeyword("exn"sv)) {
    return ctx.makeExnType(share);
  }
  if (ctx.in.takeKeyword("string"sv)) {
    return ctx.makeStringType(share);
  }
  if (ctx.in.takeKeyword("cont"sv)) {
    return ctx.makeContType(share);
  }
  if (ctx.in.takeKeyword("none"sv)) {
    return ctx.makeNoneType(share);
  }
  if (ctx.in.takeKeyword("noextern"sv)) {
    return ctx.makeNoextType(share);
  }
  if (ctx.in.takeKeyword("nofunc"sv)) {
    return ctx.makeNofuncType(share);
  }
  if (ctx.in.takeKeyword("noexn"sv)) {
    return ctx.makeNoexnType(share);
  }
  if (ctx.in.takeKeyword("nocont"sv)) {
    return ctx.makeNocontType(share);
  }
  return ctx.in.err("expected abstract heap type");
}